

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.h
# Opt level: O3

void __thiscall merlin::lbp::accept_incoming(lbp *this,size_t n)

{
  pointer pmVar1;
  pointer pfVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  pointer peVar8;
  double dVar9;
  
  pmVar1 = (this->super_factor_graph).super_graphical_model.super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  factor::operator=((this->m_beliefs).
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start + n,
                    (this->super_factor_graph).super_graphical_model.m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start + n);
  peVar8 = *(pointer *)
            &pmVar1[n].super_my_vector<merlin::edge_id>.
             super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
  if (peVar8 != *(pointer *)
                 ((long)&pmVar1[n].super_my_vector<merlin::edge_id>.
                         super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8)) {
    do {
      factor::operator=((this->m_msg).
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_start + peVar8->ridx,
                        (this->m_msg_new).
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_start + peVar8->ridx);
      factor::binaryOpIP<merlin::factor::binOpTimes>
                ((this->m_beliefs).
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start + n,
                 (this->m_msg).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                 _M_impl.super__Vector_impl_data._M_start + peVar8->ridx);
      if ((this->m_sched).t_ == Priority) {
        indexed_heap::erase(&this->m_priority,peVar8->ridx);
      }
      peVar8 = peVar8 + 1;
    } while (peVar8 != *(pointer *)
                        ((long)&pmVar1[n].super_my_vector<merlin::edge_id>.
                                super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8)
            );
  }
  pfVar2 = (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = pfVar2[n].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = *(pointer *)
            ((long)&pfVar2[n].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
  if (pdVar3 != pdVar4) {
    dVar9 = 0.0;
    pdVar6 = pdVar3;
    do {
      dVar9 = dVar9 + *pdVar6;
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != pdVar4);
    lVar5 = (long)pdVar4 - (long)pdVar3 >> 3;
    lVar7 = 0;
    do {
      pdVar3[lVar7] = (double)((ulong)(pdVar3[lVar7] / dVar9) & -(ulong)(dVar9 != 0.0));
      lVar7 = lVar7 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
  }
  return;
}

Assistant:

void accept_incoming(size_t n) {
		const my_set<edge_id>& nbrs = neighbors(n); // get the list of neighbors
		bel(n) = get_factor(n); //   and start with just the local factor
		for (my_set<edge_id>::const_iterator i = nbrs.begin();
				i != nbrs.end(); ++i) {
			m_msg[i->ridx] = m_msg_new[i->ridx]; // accept each new incoming message
			bel(n) *= m_msg[i->ridx];           //   and include it in the belief
			if (m_sched == Schedule::Priority) {
				m_priority.erase(i->ridx); // accepted => remove from priority_ queue
			}
		}
		bel(n) /= bel(n).sum(); // normalize belief
	}